

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_set.hpp
# Opt level: O0

bool __thiscall
cappuccino::ut_set<unsigned_long,_(cappuccino::thread_safe)1>::insert
          (ut_set<unsigned_long,_(cappuccino::thread_safe)1> *this,unsigned_long *key,allow a)

{
  bool bVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  expire_time_00;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  expire_time;
  time_point now;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> guard;
  allow a_local;
  unsigned_long *key_local;
  ut_set<unsigned_long,_(cappuccino::thread_safe)1> *this_local;
  
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> *)&now,
             &this->m_lock);
  expire_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  expire_time_00 = std::chrono::operator+(&expire_time,&this->m_uniform_ttl);
  do_prune(this,(time_point)expire_time.__d.__r);
  bVar1 = do_insert_update(this,key,(time_point)expire_time_00.__d.__r,a);
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::~lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> *)&now);
  return bVar1;
}

Assistant:

auto insert(const key_type& key, allow a = allow::insert_or_update) -> bool
    {
        std::lock_guard guard{m_lock};
        const auto      now         = std::chrono::steady_clock::now();
        const auto      expire_time = now + m_uniform_ttl;

        do_prune(now);

        return do_insert_update(key, expire_time, a);
    }